

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O3

RBTNode * rbt_find(RBTree *rbt,RBTNode *data)

{
  uint uVar1;
  RBTNode *pRVar2;
  
  pRVar2 = rbt->root;
  if (pRVar2 != &g_sentinel) {
    do {
      uVar1 = (*rbt->comparator)(data,pRVar2,rbt->comparator_arg);
      if (uVar1 == 0) {
        return pRVar2;
      }
      pRVar2 = (&pRVar2->left)[~uVar1 >> 0x1f];
    } while (pRVar2 != &g_sentinel);
  }
  return (RBTNode *)0x0;
}

Assistant:

RBTNode *
rbt_find(RBTree *rbt, const RBTNode *data)
{
    RBTNode    *node = rbt->root;

    while (node != RBTNIL)
    {
        int         cmp = rbt->comparator(data, node, rbt->comparator_arg);

        if (cmp == 0)
            return node;
        else if (cmp < 0)
            node = node->left;
        else
            node = node->right;
    }

    return NULL;
}